

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::TestCaseFilter::isMatch(TestCaseFilter *this,TestCaseInfo *testCase)

{
  string *psVar1;
  size_t __n;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  logic_error *this_00;
  bool bVar6;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  if (WildcardAtBothEnds < this->m_wildcardPosition) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unhandled wildcard type");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  psVar1 = &testCase->m_name;
  switch(this->m_wildcardPosition) {
  case NoWildcard:
    __n = (this->m_stringToMatch)._M_string_length;
    if (__n != (testCase->m_name)._M_string_length) {
      return false;
    }
    if (__n != 0) {
      iVar4 = bcmp((this->m_stringToMatch)._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,__n);
      return iVar4 == 0;
    }
    return true;
  case WildcardAtStart:
    uVar2 = (testCase->m_name)._M_string_length;
    uVar3 = (this->m_stringToMatch)._M_string_length;
    if ((uVar2 < uVar3) ||
       (std::__cxx11::string::substr((ulong)&local_48,(ulong)psVar1),
       local_40 != (this->m_stringToMatch)._M_string_length)) {
      bVar6 = false;
    }
    else if (local_40 == 0) {
      bVar6 = true;
    }
    else {
      iVar4 = bcmp(local_48,(this->m_stringToMatch)._M_dataplus._M_p,local_40);
      bVar6 = iVar4 == 0;
    }
    if (uVar2 < uVar3) {
      return bVar6;
    }
    break;
  case WildcardAtEnd:
    uVar2 = (testCase->m_name)._M_string_length;
    uVar3 = (this->m_stringToMatch)._M_string_length;
    bVar6 = false;
    if ((uVar3 <= uVar2) &&
       (std::__cxx11::string::substr((ulong)&local_48,(ulong)psVar1), bVar6 = false,
       local_40 == (this->m_stringToMatch)._M_string_length)) {
      if (local_40 == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp(local_48,(this->m_stringToMatch)._M_dataplus._M_p,local_40);
        bVar6 = iVar4 == 0;
      }
    }
    if (uVar2 < uVar3) {
      return bVar6;
    }
    break;
  case WildcardAtBothEnds:
    lVar5 = std::__cxx11::string::find
                      ((char *)psVar1,(ulong)(this->m_stringToMatch)._M_dataplus._M_p,0);
    return lVar5 != -1;
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return bVar6;
}

Assistant:

bool isMatch( const TestCaseInfo& testCase ) const {
            const std::string& name = testCase.getName();

            switch( m_wildcardPosition ) {
                case NoWildcard:
                    return m_stringToMatch == name;
                case WildcardAtStart:
                    return endsWith( name, m_stringToMatch );
                case WildcardAtEnd:
                    return startsWith( name, m_stringToMatch );
                case WildcardAtBothEnds:
                    return contains( name, m_stringToMatch );
            }
            throw std::logic_error( "Unhandled wildcard type" );
        }